

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O0

void __thiscall KosarajuSCC::DFS(KosarajuSCC *this,int v,bool *visited,int curr)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  value_type in_ECX;
  long in_RDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int u;
  int e;
  uint i;
  undefined4 in_stack_ffffffffffffffc8;
  value_type curr_00;
  uint uVar6;
  value_type vVar7;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined1 *)(in_RDX + in_ESI) = 1;
  vVar7 = in_ECX;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  *pvVar2 = in_ECX;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(long)vVar7);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_RDI,(value_type_conflict *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8));
  uVar6 = 0;
  while( true ) {
    uVar5 = (ulong)uVar6;
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
    if (sVar4 <= uVar5) break;
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)uVar6);
    curr_00 = *pvVar2;
    uVar5 = (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 4))(in_RDI,curr_00);
    if ((uVar5 & 1) == 0) {
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)curr_00);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,0);
      iVar1 = *pvVar2;
      uVar5 = (**(code **)((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 6))(in_RDI,iVar1);
      if (((uVar5 & 1) == 0) && ((*(byte *)(in_RDX + iVar1) & 1) == 0)) {
        DFS((KosarajuSCC *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
            (bool *)CONCAT44(vVar7,uVar6),curr_00);
      }
    }
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void KosarajuSCC::DFS(int v, bool visited[], int curr) {
	// Mark the current node as visited and print it
	visited[v] = true;
	scc[v] = curr;
	sccs[curr].push_back(v);
	// Recur for all the vertices adjacent to this vertex
	for (unsigned int i = 0; i < ingoing[v].size(); ++i) {
		const int e = ingoing[v][i];
		if (ignore_edge(e)) {
			continue;
		}
		const int u = ends[e][0];
		if (ignore_node(u)) {
			continue;
		}
		if (!visited[u]) {
			DFS(u, visited, curr);
		}
	}
}